

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

numeric * cs_impl::math_cs_ext::_min(numeric *__return_storage_ptr__,numeric *a,numeric *b)

{
  long lVar1;
  long lVar2;
  longdouble lVar3;
  longdouble lVar4;
  
  if ((a->type == true) && (b->type == true)) {
    lVar2 = (a->data)._int;
    lVar1 = (b->data)._int;
    __return_storage_ptr__->type = true;
    if (lVar1 < lVar2) {
      lVar2 = lVar1;
    }
    (__return_storage_ptr__->data)._int = lVar2;
    return __return_storage_ptr__;
  }
  lVar4 = *(longdouble *)&a->data;
  if (a->type != false) {
    lVar4 = (longdouble)(a->data)._int;
  }
  lVar3 = *(longdouble *)&b->data;
  if (b->type != false) {
    lVar3 = (longdouble)(b->data)._int;
  }
  __return_storage_ptr__->type = false;
  if (lVar3 <= lVar4 || lVar4 != lVar3) {
    lVar4 = lVar3;
  }
  *(longdouble *)&__return_storage_ptr__->data = lVar4;
  return __return_storage_ptr__;
}

Assistant:

numeric _min(const numeric& a, const numeric& b)
		{
			if (a.is_integer() && b.is_integer())
				return (std::min)(a.as_integer(), b.as_integer());
			else
				return (std::min)(a.as_float(), b.as_float());
		}